

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestStreamingImpl::doStreamI(TestStreamingImpl *this,DoStreamIContext context)

{
  WeakFulfillerBase *pWVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  SegmentReader *node;
  void *pvVar4;
  WeakFulfiller<void> *params;
  undefined8 *in_RDX;
  int iVar5;
  StructReader local_a8;
  PointerReader local_78;
  SegmentReader *local_50;
  CapTableReader *pCStack_48;
  WirePointer *local_40;
  int iStack_38;
  undefined4 uStack_34;
  
  (**(code **)*in_RDX)(&local_50);
  local_78.pointer = local_40;
  local_78.nestingLimit = iStack_38;
  local_78._28_4_ = uStack_34;
  local_78.segment = local_50;
  local_78.capTable = pCStack_48;
  iVar5 = 0;
  PointerReader::getStruct(&local_a8,&local_78,(word *)0x0);
  if (0x1f < local_a8.dataSize) {
    iVar5 = *local_a8.data;
  }
  *(int *)&context.hook[1]._vptr_CallContextHook =
       *(int *)&context.hook[1]._vptr_CallContextHook + iVar5;
  params = (WeakFulfiller<void> *)operator_new(0x18);
  pWVar1 = &params->super_WeakFulfillerBase;
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006e1308;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006e1340;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_78,params);
  local_a8.segment = local_78.segment;
  local_a8.data = (long *)0x0;
  pp_Var2 = context.hook[2]._vptr_CallContextHook;
  pp_Var3 = context.hook[3]._vptr_CallContextHook;
  context.hook[2]._vptr_CallContextHook = (_func_int **)pWVar1;
  context.hook[3]._vptr_CallContextHook = (_func_int **)params;
  local_a8.capTable = (CapTableReader *)pWVar1;
  if (pp_Var3 != (_func_int **)0x0) {
    (**(code **)*pp_Var2)(pp_Var2,(long)pp_Var3 + *(long *)(*pp_Var3 + -0x10));
  }
  pvVar4 = local_a8.data;
  (this->super_Server)._vptr_Server = (_func_int **)local_a8.segment;
  local_a8.segment = (SegmentReader *)0x0;
  if ((long *)local_a8.data != (long *)0x0) {
    local_a8.data = (long *)0x0;
    (**((Disposer *)&(local_a8.capTable)->_vptr_CapTableReader)->_vptr_Disposer)
              (local_a8.capTable,(long)pvVar4 + *(long *)(*pvVar4 + -0x10));
  }
  node = local_a8.segment;
  if (local_a8.segment != (SegmentReader *)0x0) {
    local_a8.segment = (SegmentReader *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> doStreamI(DoStreamIContext context) override {
    iSum += context.getParams().getI();
    auto paf = kj::newPromiseAndFulfiller<void>();
    fulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }